

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::AppendProperty(cmTarget *this,string *prop,char *value,bool asString)

{
  cmMakefile *pcVar1;
  char *pcVar2;
  bool bVar3;
  TargetType tgtType;
  cmMessenger *messenger;
  ostream *poVar4;
  cmTargetInternals *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  allocator local_6c9;
  value_type local_6c8;
  undefined1 local_6a8 [8];
  cmListFileBacktrace lfbt_5;
  value_type local_680;
  undefined1 local_660 [8];
  cmListFileBacktrace lfbt_4;
  cmListFileBacktrace lfbt_3;
  value_type local_618;
  undefined1 local_5f8 [8];
  cmListFileBacktrace lfbt_2;
  value_type local_5d0;
  undefined1 local_5b0 [8];
  cmListFileBacktrace lfbt_1;
  value_type local_588;
  undefined1 local_568 [8];
  cmListFileBacktrace lfbt;
  value_type local_540;
  string local_520;
  ostringstream local_500 [8];
  ostringstream e_2;
  string local_388;
  ostringstream local_368 [8];
  ostringstream e_1;
  string local_1f0;
  ostringstream local_1d0 [8];
  ostringstream e;
  cmListFileBacktrace local_48;
  byte local_21;
  char *pcStack_20;
  bool asString_local;
  char *value_local;
  string *prop_local;
  cmTarget *this_local;
  
  local_21 = asString;
  pcStack_20 = value;
  value_local = (char *)prop;
  prop_local = (string *)this;
  tgtType = GetType(this);
  pcVar2 = value_local;
  messenger = cmMakefile::GetMessenger(this->Makefile);
  cmMakefile::GetBacktrace(&local_48,this->Makefile);
  bVar3 = cmTargetPropertyComputer::PassesWhitelist(tgtType,(string *)pcVar2,messenger,&local_48);
  cmListFileBacktrace::~cmListFileBacktrace(&local_48);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            value_local,"NAME");
    if (bVar3) {
      std::__cxx11::ostringstream::ostringstream(local_1d0);
      std::operator<<((ostream *)local_1d0,"NAME property is read-only\n");
      pcVar1 = this->Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::ostringstream::~ostringstream(local_1d0);
    }
    else {
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              value_local,"EXPORT_NAME");
      if ((bVar3) && (bVar3 = IsImported(this), bVar3)) {
        std::__cxx11::ostringstream::ostringstream(local_368);
        poVar4 = std::operator<<((ostream *)local_368,
                                 "EXPORT_NAME property can\'t be set on imported targets (\"");
        poVar4 = std::operator<<(poVar4,(string *)&this->Name);
        std::operator<<(poVar4,"\")\n");
        pcVar1 = this->Makefile;
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_388);
        std::__cxx11::string::~string((string *)&local_388);
        std::__cxx11::ostringstream::~ostringstream(local_368);
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )value_local,"SOURCES");
        if ((bVar3) && (bVar3 = IsImported(this), bVar3)) {
          std::__cxx11::ostringstream::ostringstream(local_500);
          poVar4 = std::operator<<((ostream *)local_500,
                                   "SOURCES property can\'t be set on imported targets (\"");
          poVar4 = std::operator<<(poVar4,(string *)&this->Name);
          std::operator<<(poVar4,"\")\n");
          pcVar1 = this->Makefile;
          std::__cxx11::ostringstream::str();
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_520);
          std::__cxx11::string::~string((string *)&local_520);
          std::__cxx11::ostringstream::~ostringstream(local_500);
        }
        else {
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)value_local,"INCLUDE_DIRECTORIES");
          if (bVar3) {
            if ((pcStack_20 != (char *)0x0) && (*pcStack_20 != '\0')) {
              pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
              pcVar2 = pcStack_20;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_540,pcVar2,(allocator *)((long)&lfbt.Cur + 7));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&pcVar5->IncludeDirectoriesEntries,&local_540);
              std::__cxx11::string::~string((string *)&local_540);
              std::allocator<char>::~allocator((allocator<char> *)((long)&lfbt.Cur + 7));
              cmMakefile::GetBacktrace((cmListFileBacktrace *)local_568,this->Makefile);
              pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
              std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                        (&pcVar5->IncludeDirectoriesBacktraces,(value_type *)local_568);
              cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_568);
            }
          }
          else {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)value_local,"COMPILE_OPTIONS");
            if (bVar3) {
              if ((pcStack_20 != (char *)0x0) && (*pcStack_20 != '\0')) {
                pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                pcVar2 = pcStack_20;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_588,pcVar2,(allocator *)((long)&lfbt_1.Cur + 7));
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&pcVar5->CompileOptionsEntries,&local_588);
                std::__cxx11::string::~string((string *)&local_588);
                std::allocator<char>::~allocator((allocator<char> *)((long)&lfbt_1.Cur + 7));
                cmMakefile::GetBacktrace((cmListFileBacktrace *)local_5b0,this->Makefile);
                pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                          (&pcVar5->CompileOptionsBacktraces,(value_type *)local_5b0);
                cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_5b0);
              }
            }
            else {
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)value_local,"COMPILE_FEATURES");
              if (bVar3) {
                if ((pcStack_20 != (char *)0x0) && (*pcStack_20 != '\0')) {
                  pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                  pcVar2 = pcStack_20;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&local_5d0,pcVar2,(allocator *)((long)&lfbt_2.Cur + 7));
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&pcVar5->CompileFeaturesEntries,&local_5d0);
                  std::__cxx11::string::~string((string *)&local_5d0);
                  std::allocator<char>::~allocator((allocator<char> *)((long)&lfbt_2.Cur + 7));
                  cmMakefile::GetBacktrace((cmListFileBacktrace *)local_5f8,this->Makefile);
                  pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                            (&pcVar5->CompileFeaturesBacktraces,(value_type *)local_5f8);
                  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_5f8);
                }
              }
              else {
                bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)value_local,"COMPILE_DEFINITIONS");
                if (bVar3) {
                  if ((pcStack_20 != (char *)0x0) && (*pcStack_20 != '\0')) {
                    pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                    pcVar2 = pcStack_20;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              ((string *)&local_618,pcVar2,(allocator *)((long)&lfbt_3.Cur + 7));
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back(&pcVar5->CompileDefinitionsEntries,&local_618);
                    std::__cxx11::string::~string((string *)&local_618);
                    std::allocator<char>::~allocator((allocator<char> *)((long)&lfbt_3.Cur + 7));
                    cmMakefile::GetBacktrace((cmListFileBacktrace *)&lfbt_4.Cur,this->Makefile);
                    pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                    push_back(&pcVar5->CompileDefinitionsBacktraces,(value_type *)&lfbt_4.Cur);
                    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&lfbt_4.Cur);
                  }
                }
                else {
                  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)value_local,"LINK_LIBRARIES");
                  if (bVar3) {
                    if ((pcStack_20 != (char *)0x0) && (*pcStack_20 != '\0')) {
                      cmMakefile::GetBacktrace((cmListFileBacktrace *)local_660,this->Makefile);
                      pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                      pcVar2 = pcStack_20;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                ((string *)&local_680,pcVar2,(allocator *)((long)&lfbt_5.Cur + 7));
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back(&pcVar5->LinkImplementationPropertyEntries,&local_680);
                      std::__cxx11::string::~string((string *)&local_680);
                      std::allocator<char>::~allocator((allocator<char> *)((long)&lfbt_5.Cur + 7));
                      pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                      push_back(&pcVar5->LinkImplementationPropertyBacktraces,
                                (value_type *)local_660);
                      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_660);
                    }
                  }
                  else {
                    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)value_local,"SOURCES");
                    if (bVar3) {
                      cmMakefile::GetBacktrace((cmListFileBacktrace *)local_6a8,this->Makefile);
                      pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                      pcVar2 = pcStack_20;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string((string *)&local_6c8,pcVar2,&local_6c9);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back(&pcVar5->SourceEntries,&local_6c8);
                      std::__cxx11::string::~string((string *)&local_6c8);
                      std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
                      pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                      push_back(&pcVar5->SourceBacktraces,(value_type *)local_6a8);
                      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_6a8);
                    }
                    else {
                      bVar3 = cmHasLiteralPrefix<std::__cxx11::string,17ul>
                                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)value_local,(char (*) [17])"IMPORTED_LIBNAME");
                      if (bVar3) {
                        pcVar1 = this->Makefile;
                        std::operator+(&local_6f0,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)value_local," property may not be APPENDed.");
                        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_6f0);
                        std::__cxx11::string::~string((string *)&local_6f0);
                      }
                      else {
                        cmPropertyMap::AppendProperty
                                  (&this->Properties,(string *)value_local,pcStack_20,
                                   (bool)(local_21 & 1));
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void cmTarget::AppendProperty(const std::string& prop, const char* value,
                              bool asString)
{
  if (!cmTargetPropertyComputer::PassesWhitelist(
        this->GetType(), prop, this->Makefile->GetMessenger(),
        this->Makefile->GetBacktrace())) {
    return;
  }
  if (prop == "NAME") {
    std::ostringstream e;
    e << "NAME property is read-only\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "EXPORT_NAME" && this->IsImported()) {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
      << this->Name << "\")\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "SOURCES" && this->IsImported()) {
    std::ostringstream e;
    e << "SOURCES property can't be set on imported targets (\"" << this->Name
      << "\")\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "INCLUDE_DIRECTORIES") {
    if (value && *value) {
      this->Internal->IncludeDirectoriesEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->IncludeDirectoriesBacktraces.push_back(lfbt);
    }
  } else if (prop == "COMPILE_OPTIONS") {
    if (value && *value) {
      this->Internal->CompileOptionsEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileOptionsBacktraces.push_back(lfbt);
    }
  } else if (prop == "COMPILE_FEATURES") {
    if (value && *value) {
      this->Internal->CompileFeaturesEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileFeaturesBacktraces.push_back(lfbt);
    }
  } else if (prop == "COMPILE_DEFINITIONS") {
    if (value && *value) {
      this->Internal->CompileDefinitionsEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileDefinitionsBacktraces.push_back(lfbt);
    }
  } else if (prop == "LINK_LIBRARIES") {
    if (value && *value) {
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->LinkImplementationPropertyEntries.push_back(value);
      this->Internal->LinkImplementationPropertyBacktraces.push_back(lfbt);
    }
  } else if (prop == "SOURCES") {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    this->Internal->SourceEntries.push_back(value);
    this->Internal->SourceBacktraces.push_back(lfbt);
  } else if (cmHasLiteralPrefix(prop, "IMPORTED_LIBNAME")) {
    this->Makefile->IssueMessage(cmake::FATAL_ERROR,
                                 prop + " property may not be APPENDed.");
  } else {
    this->Properties.AppendProperty(prop, value, asString);
  }
}